

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,vector3h *value)

{
  bool bVar1;
  half hVar2;
  reference pvVar3;
  undefined1 local_2c [8];
  float3 v;
  vector3h *value_local;
  AsciiParser *this_local;
  
  v._M_elems._4_8_ = value;
  bVar1 = ParseBasicTypeTuple<float,3ul>(this,(array<float,_3UL> *)local_2c);
  if (bVar1) {
    pvVar3 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_2c,0);
    hVar2 = tinyusdz::value::float_to_half_full(*pvVar3);
    *(uint16_t *)v._M_elems._4_8_ = hVar2.value;
    pvVar3 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_2c,1);
    hVar2 = tinyusdz::value::float_to_half_full(*pvVar3);
    *(uint16_t *)(v._M_elems._4_8_ + 2) = hVar2.value;
    pvVar3 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)local_2c,2);
    hVar2 = tinyusdz::value::float_to_half_full(*pvVar3);
    *(uint16_t *)(v._M_elems._4_8_ + 4) = hVar2.value;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::vector3h *value) {
  value::float3 v;
  if (ParseBasicTypeTuple(&v)) {
    value->x = value::float_to_half_full(v[0]);
    value->y = value::float_to_half_full(v[1]);
    value->z = value::float_to_half_full(v[2]);
    return true;
  }
  return false;
}